

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

bool __thiscall libtorrent::bdecode_node::has_soft_error(bdecode_node *this,span<char> error)

{
  bdecode_token *pbVar1;
  bdecode_token bVar2;
  uint uVar3;
  bdecode_token bVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int token;
  vector<int,_std::allocator<int>_> stack;
  
  token = this->m_token_idx;
  uVar11 = (ulong)token;
  if ((uVar11 == 0xffffffffffffffff) ||
     (pbVar1 = this->m_root_tokens, (pbVar1[uVar11].field_0x3 & 0xe0) == 0)) {
    bVar7 = false;
  }
  else {
    stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve(&stack,100);
    do {
      iVar10 = (int)uVar11;
      uVar3 = SUB84(pbVar1[iVar10],0);
      switch((uint)((ulong)pbVar1[iVar10] >> 0x1d) & 7) {
      case 1:
      case 2:
        std::vector<int,_std::allocator<int>_>::push_back(&stack,&token);
        iVar10 = token;
        break;
      case 3:
        uVar11 = (ulong)(uVar3 & 0x1fffffff);
        if ((this->m_buffer[uVar11] == '0') && (this->m_buffer[uVar11 + 1] != ':')) {
          pcVar6 = "leading zero in string length";
LAB_001895ad:
          snprintf(error.m_ptr,error.m_len,pcVar6);
          bVar7 = true;
          goto LAB_001895c0;
        }
        break;
      case 4:
        uVar11 = (ulong)(uVar3 & 0x1fffffff);
        if ((this->m_buffer[uVar11 + 1] == '0') && (this->m_buffer[uVar11 + 2] != 'e')) {
          pcVar6 = "leading zero in integer";
          goto LAB_001895ad;
        }
        break;
      case 5:
        iVar5 = stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish[-1];
        stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        if ((((ulong)pbVar1[iVar5] & 0xe0000000) == 0x20000000) &&
           (iVar12 = iVar5 + 1, iVar10 != iVar12)) {
          pcVar6 = this->m_buffer;
          bVar4 = pbVar1[(long)iVar5 + 1];
LAB_00189479:
          iVar5 = (bVar4._4_4_ & 0x1fffffff) + iVar12;
          iVar12 = iVar5 + (SUB84(pbVar1[iVar5],4) & 0x1fffffff);
          if (iVar12 != iVar10) {
            bVar2 = pbVar1[iVar12];
            uVar3 = (bVar4._4_4_ >> 0x1d) + (bVar4._0_4_ & 0x1fffffff);
            iVar13 = ((SUB84(pbVar1[iVar5],0) & 0x1fffffff) - uVar3) + -2;
            uVar9 = (bVar2._4_4_ >> 0x1d) + (bVar2._0_4_ & 0x1fffffff);
            iVar8 = ((*(uint *)(pbVar1 + (int)((bVar2._4_4_ & 0x1fffffff) + iVar12)) & 0x1fffffff) -
                    uVar9) + -2;
            iVar5 = iVar13;
            if (iVar8 < iVar13) {
              iVar5 = iVar8;
            }
            iVar5 = memcmp(pcVar6 + (ulong)uVar3 + 2,pcVar6 + (ulong)uVar9 + 2,(long)iVar5);
            if (iVar5 < 1) goto code_r0x0018951a;
            goto LAB_0018959d;
          }
        }
      }
      token = iVar10 + 1;
      uVar11 = (ulong)(uint)token;
    } while (stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start !=
             stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
    bVar7 = false;
LAB_001895c0:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&stack.super__Vector_base<int,_std::allocator<int>_>);
  }
  return bVar7;
code_r0x0018951a:
  bVar4 = bVar2;
  if (iVar5 == 0) {
    if (iVar8 < iVar13) {
LAB_0018959d:
      pcVar6 = "unsorted dictionary key";
      goto LAB_001895ad;
    }
    if (iVar8 == iVar13) {
      pcVar6 = "duplicate dictionary key";
      goto LAB_001895ad;
    }
  }
  goto LAB_00189479;
}

Assistant:

bdecode_node::type_t bdecode_node::type() const noexcept
	{
		if (m_token_idx == -1) return none_t;
		return static_cast<bdecode_node::type_t>(m_root_tokens[m_token_idx].type);
	}